

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O1

int32_t unorm2_spanQuickCheckYes_63
                  (UNormalizer2 *norm2,UChar *s,int32_t length,UErrorCode *pErrorCode)

{
  int32_t iVar1;
  UnicodeString sString;
  ConstChar16Ptr local_70;
  UChar *local_68;
  UnicodeString local_58;
  
  iVar1 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((length < -1) || (s == (UChar *)0x0 && length != 0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      local_70.p_ = s;
      icu_63::UnicodeString::UnicodeString(&local_58,(byte)((uint)length >> 0x1f),&local_70,length);
      local_68 = local_70.p_;
      iVar1 = (**(code **)(*(long *)norm2 + 0x70))(norm2,&local_58,pErrorCode);
      icu_63::UnicodeString::~UnicodeString(&local_58);
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
unorm2_spanQuickCheckYes(const UNormalizer2 *norm2,
                         const UChar *s, int32_t length,
                         UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if((s==NULL && length!=0) || length<-1) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString sString(length<0, s, length);
    return ((const Normalizer2 *)norm2)->spanQuickCheckYes(sString, *pErrorCode);
}